

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

iterator * __thiscall
HighsHashTable<int,_double>::begin
          (iterator *__return_storage_ptr__,HighsHashTable<int,_double> *this)

{
  u64 uVar1;
  _Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false> _Var2;
  long lVar3;
  uchar *puVar4;
  
  if (this->numElements == 0) {
    lVar3 = this->tableSizeMask + 1;
    puVar4 = (this->metadata)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar3;
    _Var2._M_head_impl =
         (this->entries)._M_t.
         super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
         .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>._M_head_impl;
    __return_storage_ptr__->pos = puVar4;
    __return_storage_ptr__->end = puVar4;
    __return_storage_ptr__->entryEnd = _Var2._M_head_impl + lVar3;
  }
  else {
    puVar4 = (this->metadata)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    uVar1 = this->tableSizeMask;
    _Var2._M_head_impl =
         (this->entries)._M_t.
         super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
         .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>._M_head_impl;
    __return_storage_ptr__->pos = puVar4;
    __return_storage_ptr__->end = puVar4 + uVar1 + 1;
    __return_storage_ptr__->entryEnd = _Var2._M_head_impl + uVar1 + 1;
    if (-1 < (char)*puVar4) {
      HashTableIterator<HighsHashTableEntry<int,_double>_>::operator++(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

iterator begin() {
    if (numElements == 0) return end();
    u64 capacity = tableSizeMask + 1;
    iterator iter{metadata.get(), metadata.get() + capacity,
                  entries.get() + capacity};
    if (!occupied(metadata[0])) ++iter;

    return iter;
  }